

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_8b17::SolverDpllTriadSimd<0>::CountSolutionsConsistentWithPartialAssignment
          (SolverDpllTriadSimd<0> *this,State *state)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int band_idx;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  size_t sVar8;
  State *pSVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  State state_copy;
  State local_240;
  
  auVar12 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[0][0].configurations.vec);
  auVar13 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[0][1].configurations.vec);
  auVar16._8_8_ = 0xf000e00040000;
  auVar16._0_8_ = 0xf000e00040000;
  auVar15 = vpunpcklqdq_avx(auVar12,auVar13);
  auVar12 = vpunpckhqdq_avx(auVar12,auVar13);
  auVar14 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[0][2].configurations.vec);
  auVar12 = vpaddq_avx(auVar15,auVar12);
  auVar15 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[1][0].configurations.vec);
  auVar13 = vpunpcklqdq_avx(auVar14,auVar15);
  auVar15 = vpunpckhqdq_avx(auVar14,auVar15);
  auVar14 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[1][1].configurations.vec);
  auVar15 = vpaddq_avx(auVar13,auVar15);
  auVar13 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[1][2].configurations.vec);
  auVar18 = vpunpcklqdq_avx(auVar14,auVar13);
  auVar3 = vpunpckhqdq_avx(auVar14,auVar13);
  auVar13 = vpcmpeqd_avx(auVar13,auVar13);
  auVar16 = vpermi2w_avx512vl(auVar16,auVar12,auVar13);
  auVar13 = vpmovsxbw_avx(ZEXT816(0x70600000c080100));
  auVar14 = vpmovsxbw_avx(ZEXT816(0x7060c0803020100));
  auVar12 = vpaddq_avx(auVar18,auVar3);
  auVar15 = vpermi2w_avx512vl(auVar13,auVar16,auVar15);
  auVar12 = vpermi2w_avx512vl(auVar14,auVar15,auVar12);
  auVar15._8_2_ = 0xfff6;
  auVar15._0_8_ = 0xfff6fff6fff6fff6;
  auVar15._10_2_ = 0xfff6;
  auVar15._12_2_ = 0xfff6;
  auVar15._14_2_ = 0xfff6;
  auVar12 = vpaddw_avx(auVar12,auVar15);
  auVar12 = vphminposuw_avx(auVar12);
  if ((auVar12 & (undefined1  [16])0xff00) == (undefined1  [16])0x0) {
    uVar7 = (ulong)(auVar12._0_4_ >> 0x10);
    band_idx = *(int *)((anonymous_namespace)::tables + uVar7 * 4 + 0x18dc);
    auVar15 = *(undefined1 (*) [16])
               state->bands[*(int *)((anonymous_namespace)::tables + uVar7 * 4 + 0x18b8)][band_idx].
               configurations.vec;
    auVar13 = vpshufb_avx(auVar15,_DAT_0010ab30);
    auVar14 = vpblendd_avx2(auVar13,(undefined1  [16])0x0,8);
    auVar3 = vpshufb_avx(auVar13,_DAT_0010ab40);
    auVar13 = vpand_avx(auVar15,auVar14);
    auVar14 = vpor_avx(auVar15,auVar14);
    auVar18 = vpshufb_avx(auVar3,_DAT_0010ab30);
    auVar15 = vpand_avx(auVar13,auVar3);
    auVar17 = vpternlogq_avx512vl(auVar13,auVar14,auVar3,0xf8);
    auVar13 = vpor_avx(auVar14,auVar3);
    auVar16 = vpblendd_avx2(auVar18,(undefined1  [16])0x0,8);
    auVar14 = vpshufb_avx(auVar18,_DAT_0010ab40);
    auVar18 = vpternlogq_avx512vl(auVar15,auVar17,auVar16,0xf8);
    auVar17 = vpternlogq_avx512vl(auVar17,auVar13,auVar16,0xf8);
    auVar13 = vpor_avx(auVar13,auVar16);
    auVar3 = vpshufb_avx(auVar14,_DAT_0010ab40);
    auVar19 = vpternlogq_avx512vl(auVar18,auVar17,auVar14,0xf8);
    auVar17 = vpternlogq_avx512vl(auVar17,auVar13,auVar14,0xf8);
    auVar13 = vpor_avx(auVar13,auVar14);
    auVar20 = vpternlogq_avx512vl(auVar19,auVar17,auVar3,0xf8);
    auVar13 = vpternlogq_avx512vl(auVar13,auVar17,auVar3,0xec);
    if ((auVar13 & ~auVar20) == (undefined1  [16])0x0) {
      auVar13 = vpand_avx(auVar18,auVar14);
      auVar13 = vpternlogq_avx512vl(auVar13,auVar15,auVar16,0xf8);
      auVar13 = vpternlogq_avx512vl(auVar13,auVar19,auVar3,0xf8);
      if ((auVar20 & ~auVar13) != (undefined1  [16])0x0) {
        auVar13 = vpandn_avx(auVar13,auVar20);
      }
    }
    else {
      auVar13 = vpandn_avx(auVar20,auVar13);
    }
    auVar15 = vpcmpeqd_avx(auVar15,auVar15);
    auVar15 = vpsignw_avx(auVar13,auVar15);
    auVar15 = vpand_avx(auVar13,auVar15);
    sVar8 = this->num_guesses_ + 1;
    if (auVar12._0_4_ < 0x30000) {
      auVar12 = *(undefined1 (*) [16])state->bands[0][band_idx].configurations.vec;
      this->num_guesses_ = sVar8;
      bVar6 = false;
      lVar10 = 0;
      pSVar9 = &local_240;
      do {
        lVar11 = 0x10;
        do {
          puVar1 = (undefined8 *)((long)state->bands[lVar10 + -1][2].eliminations.vec + lVar11);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)(pSVar9->bands + -1) + 0x50 + lVar11);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          puVar1 = (undefined8 *)((long)state->bands[lVar10][0].configurations.vec + lVar11);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)pSVar9->bands[0][0].configurations.vec + lVar11);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          lVar11 = lVar11 + 0x20;
        } while (lVar11 != 0x70);
        lVar10 = 1;
        bVar5 = !bVar6;
        bVar6 = true;
        pSVar9 = (State *)(local_240.bands + 1);
      } while (bVar5);
      memcpy(local_240.boxen,state->boxen,0x120);
      auVar12 = vpand_avx(auVar12,auVar15);
      uVar7 = vpcmpgtq_avx512vl(auVar12,(undefined1  [16])0x0);
      auVar15 = vpcmpgtq_avx(auVar12,(undefined1  [16])0x0);
      auVar15 = vpslldq_avx(auVar15,1);
      auVar3._8_8_ = 1;
      auVar3._0_8_ = 1;
      auVar15 = vandnpd_avx512vl(auVar15,auVar3);
      auVar15 = vpsubq_avx512vl(auVar12,auVar15);
      bVar6 = (bool)((byte)(uVar7 & 3) & 1);
      auVar18._0_8_ = (ulong)bVar6 * auVar15._0_8_ | (ulong)!bVar6 * auVar12._0_8_;
      uVar7 = (uVar7 & 3) >> 1;
      auVar18._8_8_ = uVar7 * auVar15._8_8_ | (ulong)!SUB81(uVar7,0) * auVar12._8_8_;
      auVar15 = vpand_avx(auVar18,auVar12);
      auVar13 = vpor_avx(auVar15,*(undefined1 (*) [16])local_240.bands[0][band_idx].eliminations.vec
                        );
      *(undefined1 (*) [16])local_240.bands[0][band_idx].eliminations.vec = auVar13;
      bVar6 = BandEliminate<0>(&local_240,band_idx,0);
      if ((bVar6) &&
         (CountSolutionsConsistentWithPartialAssignment(this,&local_240),
         this->num_solutions_ == this->limit_)) {
        return;
      }
      auVar12 = vpternlogq_avx512vl(auVar12,auVar15,
                                    *(undefined1 (*) [16])state->bands[0][band_idx].eliminations.vec
                                    ,0xbe);
      *(undefined1 (*) [16])state->bands[0][band_idx].eliminations.vec = auVar12;
      bVar6 = BandEliminate<0>(state,band_idx,0);
    }
    else {
      bVar6 = false;
      lVar10 = 0;
      auVar12 = *(undefined1 (*) [16])state->boxen[(long)band_idx + -3].cells.vec;
      this->num_guesses_ = sVar8;
      pSVar9 = &local_240;
      do {
        lVar11 = 0x10;
        do {
          puVar1 = (undefined8 *)((long)state->bands[lVar10 + -1][2].eliminations.vec + lVar11);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)(pSVar9->bands + -1) + 0x50 + lVar11);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          puVar1 = (undefined8 *)((long)state->bands[lVar10][0].configurations.vec + lVar11);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)pSVar9->bands[0][0].configurations.vec + lVar11);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          lVar11 = lVar11 + 0x20;
        } while (lVar11 != 0x70);
        lVar10 = 1;
        bVar5 = !bVar6;
        bVar6 = true;
        pSVar9 = (State *)(local_240.bands + 1);
      } while (bVar5);
      memcpy(local_240.boxen,state->boxen,0x120);
      auVar12 = vpand_avx(auVar12,auVar15);
      uVar7 = vpcmpgtq_avx512vl(auVar12,(undefined1  [16])0x0);
      auVar15 = vpcmpgtq_avx(auVar12,(undefined1  [16])0x0);
      auVar15 = vpslldq_avx(auVar15,1);
      auVar13._8_8_ = 1;
      auVar13._0_8_ = 1;
      auVar15 = vandnpd_avx512vl(auVar15,auVar13);
      auVar15 = vpsubq_avx512vl(auVar12,auVar15);
      bVar6 = (bool)((byte)(uVar7 & 3) & 1);
      auVar14._0_8_ = (ulong)bVar6 * auVar15._0_8_ | (ulong)!bVar6 * auVar12._0_8_;
      uVar7 = (uVar7 & 3) >> 1;
      auVar14._8_8_ = uVar7 * auVar15._8_8_ | (ulong)!SUB81(uVar7,0) * auVar12._8_8_;
      auVar15 = vpand_avx(auVar14,auVar12);
      auVar13 = vpor_avx(auVar15,*(undefined1 (*) [16])
                                  (local_240.boxen[(long)band_idx + -3].cells.vec + 2));
      *(undefined1 (*) [16])(local_240.boxen[(long)band_idx + -3].cells.vec + 2) = auVar13;
      bVar6 = BandEliminate<1>(&local_240,band_idx,0);
      if ((bVar6) &&
         (CountSolutionsConsistentWithPartialAssignment(this,&local_240),
         this->num_solutions_ == this->limit_)) {
        return;
      }
      auVar12 = vpternlogq_avx512vl(auVar12,auVar15,
                                    *(undefined1 (*) [16])
                                     (state->boxen[(long)band_idx + -3].cells.vec + 2),0xbe);
      *(undefined1 (*) [16])(state->boxen[(long)band_idx + -3].cells.vec + 2) = auVar12;
      bVar6 = BandEliminate<1>(state,band_idx,0);
    }
    if (bVar6 != false) {
      CountSolutionsConsistentWithPartialAssignment(this,state);
    }
  }
  else {
    this->num_solutions_ = this->num_solutions_ + 1;
  }
  return;
}

Assistant:

void CountSolutionsConsistentWithPartialAssignment(State &state) {
        auto band_and_value = ChooseBandAndValueToBranch(state);
        if (band_and_value.first == NONE) {
            num_solutions_++;
            if (solution_mode == 1 && num_solutions_ == limit_) solution_ = state;
            if (solution_mode == 2) ReportSolution(state);
        } else {
            if (band_and_value.first < 3) {
                BranchOnBandAndValue<0>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            } else {
                BranchOnBandAndValue<1>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            }
        }
    }